

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

bool Args::details::argNameLess<Args::ArgIface*>(ArgIface **a1,ArgIface **a2)

{
  byte extraout_var;
  int iVar1;
  byte extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  byte bVar2;
  bool bVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QArrayData *local_a0;
  storage_type_conflict *local_98;
  long local_90;
  QArrayData *local_88;
  storage_type_conflict *local_80;
  qsizetype local_78;
  QArrayData *local_70;
  storage_type_conflict *local_68;
  qsizetype local_60;
  QArrayData *local_58;
  short *local_50;
  QArrayData *local_40 [2];
  long local_30;
  
  (*(*a1)->_vptr_ArgIface[3])(&local_a0);
  if (local_90 == 0) {
    bVar3 = false;
  }
  else {
    (*(*a2)->_vptr_ArgIface[3])(local_40);
    bVar3 = local_30 != 0;
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,8);
      }
    }
  }
  if (local_a0 != (QArrayData *)0x0) {
    LOCK();
    (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0,2,8);
    }
  }
  if (bVar3) {
    (*(*a1)->_vptr_ArgIface[3])(&local_a0);
    if (*local_98 == L'-') {
      bVar3 = false;
    }
    else {
      (*(*a2)->_vptr_ArgIface[3])(&local_88);
      bVar3 = *local_80 == L'-';
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,8);
        }
      }
    }
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,2,8);
      }
    }
    if (bVar3) {
      return true;
    }
    (*(*a1)->_vptr_ArgIface[3])(&local_a0);
    if (*local_98 == L'-') {
      (*(*a2)->_vptr_ArgIface[3])(&local_58);
      bVar3 = *local_50 != 0x2d;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,8);
        }
      }
    }
    else {
      bVar3 = false;
    }
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,2,8);
      }
    }
    if (!bVar3) {
      iVar1 = (*(*a1)->_vptr_ArgIface[8])();
      if ((*(long *)(CONCAT44(extraout_var_01,iVar1) + 0x10) == 0) &&
         (iVar1 = (*(*a2)->_vptr_ArgIface[8])(),
         *(long *)(CONCAT44(extraout_var_04,iVar1) + 0x10) != 0)) {
        return true;
      }
      iVar1 = (*(*a1)->_vptr_ArgIface[8])();
      if ((*(long *)(CONCAT44(extraout_var_02,iVar1) + 0x10) == 0) ||
         (iVar1 = (*(*a2)->_vptr_ArgIface[8])(),
         *(long *)(CONCAT44(extraout_var_03,iVar1) + 0x10) != 0)) {
        (*(*a1)->_vptr_ArgIface[3])(&local_a0);
        (*(*a2)->_vptr_ArgIface[3])(&local_70);
        QVar5.m_data = local_98;
        QVar5.m_size = local_90;
        QVar7.m_data = local_68;
        QVar7.m_size = local_60;
        QtPrivate::compareStrings(QVar5,QVar7,CaseSensitive);
        bVar2 = extraout_var_00;
        if (local_70 != (QArrayData *)0x0) {
          LOCK();
          (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar1 = (local_70->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          local_88 = local_70;
          goto joined_r0x0010c778;
        }
        goto LAB_0010c78e;
      }
    }
    bVar3 = false;
  }
  else {
    (*(*a1)->_vptr_ArgIface[3])(&local_a0);
    (*(*a2)->_vptr_ArgIface[3])(&local_88);
    QVar4.m_data = local_98;
    QVar4.m_size = local_90;
    QVar6.m_data = local_80;
    QVar6.m_size = local_78;
    QtPrivate::compareStrings(QVar4,QVar6,CaseSensitive);
    bVar2 = extraout_var;
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = (local_88->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x0010c778:
      if (iVar1 == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
LAB_0010c78e:
    bVar3 = (bool)(bVar2 >> 7);
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,2,8);
      }
    }
  }
  return bVar3;
}

Assistant:

bool argNameLess( const T & a1, const T & a2 )
{
	static const Char dash = SL( '-' );

	if( !a1->name().empty() && !a2->name().empty() )
	{
		if( *( a1->name().cbegin() ) != dash &&
				*( a2->name().cbegin() ) == dash )
			return true;
		else if( *( a1->name().cbegin() ) == dash &&
				*( a2->name().cbegin() ) != dash )
			return false;
		else if( a1->argumentName().empty() && !a2->argumentName().empty() )
			return true;
		else if( !a1->argumentName().empty() && a2->argumentName().empty() )
			return false;
		else
			return ( a1->name() < a2->name() );
	}
	else
		return ( a1->name() < a2->name() );
}